

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  fout f_00;
  fout *pfVar3;
  char cVar4;
  int iVar5;
  rnndb *db;
  size_t sVar6;
  char *pcVar7;
  FILE *pFVar8;
  char *pcVar9;
  ushort **ppuVar10;
  __int32_t **pp_Var11;
  rnnenum *prVar12;
  rnnbitset *prVar13;
  rnndomain *prVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  fout f;
  
  if (argc < 2) {
LAB_00102151:
    main_cold_2();
    xmlCheckVersion(0x51b1);
    iVar5 = xmlInitParser();
    return iVar5;
  }
  rnn_init();
  db = rnn_newdb();
  rnn_parsefile(db,argv[1]);
  rnn_prepdb(db);
  if (0 < db->filesnum) {
    lVar17 = 0;
    do {
      pcVar2 = db->files[lVar17];
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 3);
      strcpy(pcVar7,pcVar2);
      sVar6 = strlen(pcVar7);
      (pcVar7 + sVar6)[0] = '.';
      (pcVar7 + sVar6)[1] = 'h';
      pcVar7[sVar6 + 2] = '\0';
      pcVar2 = db->files[lVar17];
      pFVar8 = fopen(pcVar7,"w");
      if (pFVar8 == (FILE *)0x0) {
        main_cold_1();
        goto LAB_00102151;
      }
      free(pcVar7);
      pcVar9 = strrchr(pcVar2,0x2f);
      pcVar7 = pcVar9 + 1;
      if (pcVar9 == (char *)0x0) {
        pcVar7 = pcVar2;
      }
      pcVar7 = strdup(pcVar7);
      if (*pcVar7 != '\0') {
        ppuVar10 = __ctype_b_loc();
        uVar16 = 0;
        do {
          cVar1 = pcVar7[uVar16];
          cVar4 = '_';
          if (((*ppuVar10)[cVar1] & 8) != 0) {
            pp_Var11 = __ctype_toupper_loc();
            cVar4 = (char)(*pp_Var11)[cVar1];
          }
          pcVar7[uVar16] = cVar4;
          uVar16 = uVar16 + 1;
          sVar6 = strlen(pcVar7);
        } while (uVar16 < sVar6);
      }
      if (foutsmax <= foutsnum) {
        iVar5 = foutsmax * 2;
        if (foutsmax == 0) {
          iVar5 = 0x10;
        }
        foutsmax = iVar5;
        fouts = (fout *)realloc(fouts,(long)iVar5 * 0x18);
      }
      pfVar3 = fouts;
      lVar15 = (long)foutsnum;
      foutsnum = foutsnum + 1;
      fouts[lVar15].guard = pcVar7;
      pfVar3[lVar15].name = pcVar2;
      pfVar3[lVar15].file = (FILE *)pFVar8;
      f_00.file = (FILE *)pFVar8;
      f_00.name = pcVar2;
      f_00.guard = pcVar7;
      printhead(f_00,db);
      lVar17 = lVar17 + 1;
    } while (lVar17 < db->filesnum);
  }
  if (0 < db->enumsnum) {
    lVar17 = 0;
    do {
      if ((db->enums[lVar17]->isinline == 0) && (prVar12 = db->enums[lVar17], 0 < prVar12->valsnum))
      {
        lVar15 = 0;
        do {
          printvalue(prVar12->vals[lVar15],0);
          lVar15 = lVar15 + 1;
          prVar12 = db->enums[lVar17];
        } while (lVar15 < prVar12->valsnum);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < db->enumsnum);
  }
  if (0 < db->bitsetsnum) {
    lVar17 = 0;
    do {
      if ((db->bitsets[lVar17]->isinline == 0) &&
         (prVar13 = db->bitsets[lVar17], 0 < prVar13->bitfieldsnum)) {
        lVar15 = 0;
        do {
          printbitfield(prVar13->bitfields[lVar15],0);
          lVar15 = lVar15 + 1;
          prVar13 = db->bitsets[lVar17];
        } while (lVar15 < prVar13->bitfieldsnum);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < db->bitsetsnum);
  }
  if (0 < db->domainsnum) {
    lVar17 = 0;
    do {
      prVar14 = db->domains[lVar17];
      if (prVar14->size != 0) {
        printdef(prVar14->fullname,"SIZE",0,prVar14->size,prVar14->file);
      }
      prVar14 = db->domains[lVar17];
      if (0 < prVar14->subelemsnum) {
        lVar15 = 0;
        do {
          printdelem(prVar14->subelems[lVar15],0);
          lVar15 = lVar15 + 1;
          prVar14 = db->domains[lVar17];
        } while (lVar15 < prVar14->subelemsnum);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < db->domainsnum);
  }
  if (0 < foutsnum) {
    lVar15 = 0x10;
    lVar17 = 0;
    do {
      fprintf(*(FILE **)((long)fouts + lVar15 + -8),"\n#endif /* %s */\n",
              *(undefined8 *)((long)&fouts->name + lVar15));
      lVar17 = lVar17 + 1;
      lVar15 = lVar15 + 0x18;
    } while (lVar17 < foutsnum);
  }
  iVar5 = db->estatus;
  rnn_freedb(db);
  rnn_fini();
  return iVar5;
}

Assistant:

int main(int argc, char **argv) {
	struct rnndb *db;
	int i, j, ret;

	if (argc < 2) {
		fprintf(stderr, "Usage:\n\theadergen database-file\n");
		exit(1);
	}

	rnn_init();
	db = rnn_newdb();
	rnn_parsefile (db, argv[1]);
	rnn_prepdb (db);
	for(i = 0; i < db->filesnum; ++i) {
		char *dstname = malloc(strlen(db->files[i]) + 3);
		char *pretty;
		strcpy(dstname, db->files[i]);
		strcat(dstname, ".h");
		struct fout f = { db->files[i], fopen(dstname, "w") };
		if (!f.file) {
			perror(dstname);
			exit(1);
		}
		free(dstname);
		pretty = strrchr(f.name, '/');
		if (pretty)
			pretty += 1;
		else
			pretty = f.name;
		f.guard = strdup(pretty);
		for (j = 0; j < strlen(f.guard); j++)
			if (isalnum(f.guard[j]))
				f.guard[j] = toupper(f.guard[j]);
			else
				f.guard[j] = '_';
		ADDARRAY(fouts, f);
		printhead(f, db);
	}

	for (i = 0; i < db->enumsnum; i++) {
		if (db->enums[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->enums[i]->valsnum; j++)
			printvalue (db->enums[i]->vals[j], 0);
	}
	for (i = 0; i < db->bitsetsnum; i++) {
		if (db->bitsets[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->bitsets[i]->bitfieldsnum; j++)
			printbitfield (db->bitsets[i]->bitfields[j], 0);
	}
	for (i = 0; i < db->domainsnum; i++) {
		if (db->domains[i]->size)
			printdef (db->domains[i]->fullname, "SIZE", 0, db->domains[i]->size, db->domains[i]->file);
		int j;
		for (j = 0; j < db->domains[i]->subelemsnum; j++) {
			printdelem(db->domains[i]->subelems[j], 0);
		}
	}
	for(i = 0; i < foutsnum; ++i) {
		fprintf (fouts[i].file, "\n#endif /* %s */\n", fouts[i].guard);
	}
	ret = db->estatus;

	rnn_freedb(db);
	rnn_fini();

	return ret;
}